

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall
CommandInInventory::ParseNegatable(CommandInInventory *this,FScanner *sc,bool fullScreenOffsets)

{
  bool bVar1;
  PClassActor *pPVar2;
  long lVar3;
  
  bVar1 = FScanner::CheckToken(sc,0x102);
  if (!bVar1) {
    FScanner::MustGetToken(sc,0x101);
  }
  lVar3 = 0;
  do {
    pPVar2 = PClass::FindActor(sc->String);
    this->item[lVar3] = pPVar2;
    if (pPVar2 == (PClassActor *)0x0) {
LAB_00600e79:
      FScanner::ScriptMessage(sc,"\'%s\' is not a type of inventory item.",sc->String);
      this->item[lVar3] = (PClassActor *)AInventory::RegistrationInfo.MyClass;
    }
    else if (pPVar2 != (PClassActor *)AInventory::RegistrationInfo.MyClass) {
      do {
        pPVar2 = (PClassActor *)(pPVar2->super_PClass).ParentClass;
        if (pPVar2 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
      } while (pPVar2 != (PClassActor *)0x0);
      if (pPVar2 == (PClassActor *)0x0) goto LAB_00600e79;
    }
    bVar1 = FScanner::CheckToken(sc,0x2c);
    if (bVar1) {
      FScanner::MustGetNumber(sc);
      this->amount[lVar3] = sc->Number;
    }
    bVar1 = FScanner::CheckToken(sc,0x11c);
    if (bVar1) {
      this->conditionAnd = false;
    }
    else {
      bVar1 = FScanner::CheckToken(sc,0x11b);
      if (!bVar1) {
        return;
      }
      this->conditionAnd = true;
    }
    bVar1 = FScanner::CheckToken(sc,0x102);
    if (!bVar1) {
      FScanner::MustGetToken(sc,0x101);
    }
    bVar1 = lVar3 != 0;
    lVar3 = lVar3 + 1;
    if (bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void	ParseNegatable(FScanner &sc, bool fullScreenOffsets)
		{
			if(!sc.CheckToken(TK_StringConst))
				sc.MustGetToken(TK_Identifier);
			for(int i = 0;i < 2;i++)
			{
				item[i] = PClass::FindActor(sc.String);
				if(item[i] == NULL || !RUNTIME_CLASS(AInventory)->IsAncestorOf(item[i]))
				{
					sc.ScriptMessage("'%s' is not a type of inventory item.", sc.String);
					item[i] = RUNTIME_CLASS(AInventory);
				}
		
				if (sc.CheckToken(','))
				{
					sc.MustGetNumber();
					amount[i] = sc.Number;
				}
		
				if(sc.CheckToken(TK_OrOr))
				{
					conditionAnd = false;
					if(!sc.CheckToken(TK_StringConst))
						sc.MustGetToken(TK_Identifier);
				}
				else if(sc.CheckToken(TK_AndAnd))
				{
					conditionAnd = true;
					if(!sc.CheckToken(TK_StringConst))
						sc.MustGetToken(TK_Identifier);
				}
				else
					break;
			}
		}